

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

void * __thiscall
btSortedOverlappingPairCache::removeOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  int *piVar1;
  btCollisionAlgorithm **ppbVar2;
  uint uVar3;
  btBroadphasePair *pbVar4;
  btOverlappingPairCallback *pbVar5;
  btBroadphasePair *pbVar6;
  btBroadphaseProxy *pbVar7;
  btCollisionAlgorithm *pbVar8;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar9;
  btBroadphaseProxy *pbVar10;
  btCollisionAlgorithm *pbVar11;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar12;
  int iVar13;
  long lVar14;
  btBroadphaseProxy *pbVar15;
  btBroadphaseProxy **ppbVar16;
  ulong uVar17;
  btBroadphaseProxy *pbVar18;
  
  iVar13 = (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
             _vptr_btOverlappingPairCallback[0xe])();
  if ((char)iVar13 == '\0') {
    pbVar15 = proxy1;
    pbVar18 = proxy0;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      pbVar15 = proxy0;
      pbVar18 = proxy1;
    }
    uVar3 = (this->m_overlappingPairArray).m_size;
    if (0 < (int)uVar3) {
      ppbVar16 = &((this->m_overlappingPairArray).m_data)->m_pProxy1;
      uVar17 = 0;
      do {
        if ((((btBroadphasePair *)(ppbVar16 + -1))->m_pProxy0 == pbVar15) && (*ppbVar16 == pbVar18))
        goto LAB_00138a67;
        uVar17 = uVar17 + 1;
        ppbVar16 = ppbVar16 + 4;
      } while (uVar3 != uVar17);
    }
    uVar17 = (ulong)uVar3;
LAB_00138a67:
    iVar13 = (int)uVar17;
    pbVar18 = proxy1;
    if (iVar13 < (int)uVar3) {
      gOverlappingPairs = gOverlappingPairs + -1;
      pbVar4 = (this->m_overlappingPairArray).m_data;
      pbVar18 = (btBroadphaseProxy *)pbVar4[iVar13].field_3.m_internalInfo1;
      (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
        _vptr_btOverlappingPairCallback[8])(this,pbVar4 + iVar13);
      pbVar5 = this->m_ghostPairCallback;
      if (pbVar5 != (btOverlappingPairCallback *)0x0) {
        (*pbVar5->_vptr_btOverlappingPairCallback[3])(pbVar5,proxy0,proxy1,dispatcher);
      }
      lVar14 = (long)(this->m_overlappingPairArray).m_capacity;
      pbVar4 = (this->m_overlappingPairArray).m_data;
      pbVar15 = pbVar4[iVar13].m_pProxy0;
      pbVar7 = pbVar4[iVar13].m_pProxy1;
      pbVar8 = pbVar4[iVar13].m_algorithm;
      aVar9 = *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar4[iVar13].m_algorithm + 1);
      pbVar10 = pbVar4[lVar14 + -1].m_pProxy1;
      pbVar11 = pbVar4[lVar14 + -1].m_algorithm;
      aVar12 = *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)
                (&pbVar4[lVar14 + -1].m_algorithm + 1);
      pbVar4[iVar13].m_pProxy0 = pbVar4[lVar14 + -1].m_pProxy0;
      pbVar4[iVar13].m_pProxy1 = pbVar10;
      pbVar4[iVar13].m_algorithm = pbVar11;
      *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar4[iVar13].m_algorithm + 1) = aVar12;
      pbVar6 = (this->m_overlappingPairArray).m_data;
      pbVar4 = pbVar6 + lVar14 + -1;
      pbVar4->m_pProxy0 = pbVar15;
      pbVar4->m_pProxy1 = pbVar7;
      ppbVar2 = &pbVar6[lVar14 + -1].m_algorithm;
      *ppbVar2 = pbVar8;
      *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(ppbVar2 + 1) = aVar9;
      piVar1 = &(this->m_overlappingPairArray).m_size;
      *piVar1 = *piVar1 + -1;
    }
    if (iVar13 < (int)uVar3) {
      return pbVar18;
    }
  }
  return (void *)0x0;
}

Assistant:

void*	btSortedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1, btDispatcher* dispatcher )
{
	if (!hasDeferredRemoval())
	{
		btBroadphasePair findPair(*proxy0,*proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			gOverlappingPairs--;
			btBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair,dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);
			
			m_overlappingPairArray.swap(findIndex,m_overlappingPairArray.capacity()-1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}